

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void cmFortranModuleAppendUpperLower(string *mod,string *mod_upper,string *mod_lower)

{
  string *psVar1;
  bool bVar2;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *ext;
  string *local_30;
  string *name;
  size_type ext_len;
  string *mod_lower_local;
  string *mod_upper_local;
  string *mod_local;
  
  name = (string *)0x0;
  ext_len = (size_type)mod_lower;
  mod_lower_local = mod_upper;
  mod_upper_local = mod;
  bVar2 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(mod,(char (*) [5])".mod");
  if (bVar2) {
    name = (string *)0x4;
  }
  else {
    bVar2 = cmHasLiteralSuffix<std::__cxx11::string,6ul>(mod_upper_local,(char (*) [6])".smod");
    if (bVar2) {
      name = (string *)0x5;
    }
  }
  psVar1 = mod_upper_local;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&ext,(ulong)psVar1);
  psVar1 = mod_upper_local;
  local_30 = (string *)&ext;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&local_78,(ulong)psVar1);
  local_58 = &local_78;
  cmsys::SystemTools::UpperCase(&local_c8,local_30);
  std::operator+(&local_a8,&local_c8,local_58);
  std::__cxx11::string::operator+=((string *)mod_lower_local,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::operator+=((string *)ext_len,(string *)mod_upper_local);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

static void cmFortranModuleAppendUpperLower(std::string const& mod,
                                            std::string& mod_upper,
                                            std::string& mod_lower)
{
  std::string::size_type ext_len = 0;
  if (cmHasLiteralSuffix(mod, ".mod")) {
    ext_len = 4;
  } else if (cmHasLiteralSuffix(mod, ".smod")) {
    ext_len = 5;
  }
  std::string const& name = mod.substr(0, mod.size() - ext_len);
  std::string const& ext = mod.substr(mod.size() - ext_len);
  mod_upper += cmSystemTools::UpperCase(name) + ext;
  mod_lower += mod;
}